

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O0

string * __thiscall
MinVR::VRDisplayNode::printNode
          (VRDisplayNode *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *valuesSet,string *prefix)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  reference ppVVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  VRDisplayNode *in_RDX;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  const_iterator it_2;
  const_iterator it_1;
  const_iterator it;
  string newPrefix;
  string name;
  string *out;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb38;
  VRDisplayNode *in_stack_fffffffffffffb40;
  iterator in_stack_fffffffffffffb48;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb58;
  char *in_stack_fffffffffffffb60;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_438 [32];
  string local_418 [32];
  VRDisplayNode **local_3f8;
  __normal_iterator<MinVR::VRDisplayNode_*const_*,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
  local_3f0;
  string local_3e8 [32];
  string local_3c8 [32];
  _List_node_base *local_3a8;
  _Self local_3a0;
  _Self local_398;
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  _Self local_330;
  _Self local_328;
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  _List_node_base *local_2a0;
  _Base_ptr local_298;
  undefined1 local_290;
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  _Self local_228;
  _Self local_220;
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [39];
  byte local_d1;
  string local_d0 [48];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [24];
  string *in_stack_ffffffffffffffd8;
  VRDisplayNode *this_01;
  
  __rhs = in_RDI;
  this_01 = in_RDX;
  std::__cxx11::string::string(local_40);
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < 0x31) {
    std::__cxx11::string::operator=(local_40,(string *)(in_RSI + 4));
  }
  else {
    std::__cxx11::string::substr((ulong)local_a0,(ulong)(in_RSI + 4));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb48._M_node,(char *)in_stack_fffffffffffffb40);
    in_stack_fffffffffffffb68 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 4);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_d0,(ulong)in_stack_fffffffffffffb68);
    std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDX);
    std::__cxx11::string::operator=(local_40,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
  }
  local_d1 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator=((string *)in_RDI,"\n");
  }
  std::operator+(in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb48._M_node,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb48._M_node,(char *)in_stack_fffffffffffffb40);
  this_00 = local_f8;
  std::__cxx11::string::operator=((string *)in_RDI,this_00);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_138);
  std::operator+(in_stack_fffffffffffffb68,(char *)this_00);
  std::operator+((char *)in_RSI,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb48._M_node,(char *)in_stack_fffffffffffffb40);
  (**(code **)(*in_RSI + 0x18))(local_1d8);
  std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX)
  ;
  std::__cxx11::string::operator+=((string *)in_RDI,local_178);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_1b8);
  std::operator+((char *)in_RSI,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb48._M_node,(char *)in_stack_fffffffffffffb40);
  std::__cxx11::string::operator+=((string *)in_RDI,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_218);
  local_220._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb38);
  while( true ) {
    local_228._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb38);
    bVar1 = std::operator!=(&local_220,&local_228);
    if (!bVar1) break;
    std::operator+((char *)in_RSI,__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb48._M_node,(char *)in_stack_fffffffffffffb40);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffb40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb48._M_node,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb40);
    std::__cxx11::string::operator+=((string *)in_RDI,local_248);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_288);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffb40);
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00,(value_type *)in_stack_fffffffffffffb58._M_node);
    in_stack_fffffffffffffb58 = pVar5.first._M_node;
    local_290 = pVar5.second;
    local_298 = in_stack_fffffffffffffb58._M_node;
    local_2a0 = (_List_node_base *)
                std::
                _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&local_220,0);
  }
  bVar1 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(in_RSI + 8));
  if (bVar1) {
    std::operator+((char *)in_RSI,__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb48._M_node,(char *)in_stack_fffffffffffffb40);
    std::__cxx11::string::operator+=((string *)in_RDI,local_2c0);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string(local_2e0);
  }
  std::operator+((char *)in_RSI,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb48._M_node,(char *)in_stack_fffffffffffffb40);
  std::__cxx11::string::operator+=((string *)in_RDI,local_300);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string(local_320);
  local_328._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
       ::begin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                *)in_stack_fffffffffffffb38);
  while( true ) {
    local_330._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         ::end((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                *)in_stack_fffffffffffffb38);
    bVar1 = std::operator!=(&local_328,&local_330);
    if (!bVar1) break;
    std::operator+((char *)in_RSI,__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb48._M_node,(char *)in_stack_fffffffffffffb40);
    std::
    _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
    ::operator->((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                  *)in_stack_fffffffffffffb40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb48._M_node,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb40);
    std::__cxx11::string::operator+=((string *)in_RDI,local_350);
    std::__cxx11::string::~string(local_350);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::string::~string(local_390);
    ppVar3 = std::
             _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
             ::operator->((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                           *)in_stack_fffffffffffffb40);
    if ((ppVar3->second & 1U) == 0) {
      std::__cxx11::string::operator+=((string *)in_RDI," (optional)");
    }
    else {
      std::__cxx11::string::operator+=((string *)in_RDI," (required)");
    }
    std::
    _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
    ::operator->((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                  *)in_stack_fffffffffffffb40);
    in_stack_fffffffffffffb48 =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(in_stack_fffffffffffffb48._M_node,(key_type *)in_stack_fffffffffffffb40);
    local_398._M_node = in_stack_fffffffffffffb48._M_node;
    local_3a0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_fffffffffffffb38);
    bVar1 = std::operator==(&local_398,&local_3a0);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)in_RDI," <-- ERROR: this value will not be found.")
      ;
    }
    local_3a8 = (_List_node_base *)
                std::
                _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
                ::operator++(&local_328,0);
  }
  bVar1 = std::__cxx11::
          list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::empty((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                   *)(in_RSI + 0xb));
  if (bVar1) {
    std::operator+((char *)in_RSI,__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb48._M_node,(char *)in_stack_fffffffffffffb40);
    std::__cxx11::string::operator+=((string *)in_RDI,local_3c8);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::string::~string(local_3e8);
  }
  local_3f0._M_current =
       (VRDisplayNode **)
       std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::begin
                 ((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_> *)
                  in_stack_fffffffffffffb38);
  while( true ) {
    local_3f8 = (VRDisplayNode **)
                std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>::end
                          ((vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                            *)in_stack_fffffffffffffb38);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<MinVR::VRDisplayNode_*const_*,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                        *)in_stack_fffffffffffffb40,
                       (__normal_iterator<MinVR::VRDisplayNode_*const_*,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                        *)in_stack_fffffffffffffb38);
    if (!bVar1) break;
    ppVVar4 = __gnu_cxx::
              __normal_iterator<MinVR::VRDisplayNode_*const_*,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
              ::operator*(&local_3f0);
    in_stack_fffffffffffffb40 = *ppVVar4;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    printNode(this_01,in_RCX,in_stack_ffffffffffffffd8);
    std::operator+((char *)in_stack_fffffffffffffb48._M_node,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb40);
    std::__cxx11::string::operator+=((string *)in_RDI,local_418);
    std::__cxx11::string::~string(local_418);
    std::__cxx11::string::~string(local_438);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x16f494);
    __gnu_cxx::
    __normal_iterator<MinVR::VRDisplayNode_*const_*,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
    ::operator++((__normal_iterator<MinVR::VRDisplayNode_*const_*,_std::vector<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>_>
                  *)in_stack_fffffffffffffb48._M_node,
                 (int)((ulong)in_stack_fffffffffffffb40 >> 0x20));
  }
  local_d1 = 1;
  std::__cxx11::string::~string(local_158);
  if ((local_d1 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  std::__cxx11::string::~string(local_40);
  return __rhs;
}

Assistant:

std::string VRDisplayNode::printNode(std::set<std::string> valuesSet,
                                     const std::string &prefix) const {

  // First compress the long names a little bit for readability.
  std::string name;
  if (_name.size() > 48) {
    name = _name.substr(0,8) + "..." +
      _name.substr(_name.size() - 40, std::string::npos);

  } else {
    name = _name;
  }

  // Establish the output.
  std::string out;
  if (!prefix.empty()) out = "\n";

  // Display this node.
  out = prefix + "<displayNode:" + name + ">";

  // The lines following need a longer prefix.
  std::string newPrefix = prefix + " | ";

  out += "\n" + newPrefix + "  Type: " + getType();

  // Print the values added, but also add them to the set of values we
  // know from above this position in the display graph.
  out += "\n" + newPrefix + "  Values Added:";
  for (std::list<std::string>::const_iterator it = _valuesAdded.begin();
       it != _valuesAdded.end(); it++) {
    // Print the value added.
    out += "\n" + newPrefix + "    " + *it;

    // Insert it added value into the set from above.
    valuesSet.insert(*it);
  }
  if (_valuesAdded.empty()) out += "\n" + newPrefix + "     <none>";

  // Print the values needed, but also check them against the values already set.
  out += "\n" + newPrefix + "  Values Needed:";
  for (std::list<std::pair<std::string, bool> >::const_iterator it = _valuesNeeded.begin();
       it != _valuesNeeded.end(); it++) {
    out += "\n" + newPrefix + "    " + it->first;
    if (it->second) {
      out += " (required)";
    } else {
      out += " (optional)";
    }

    // If the name is not in the value set, flag it.
    if (valuesSet.find(it->first) == valuesSet.end()) {

      out += " <-- ERROR: this value will not be found.";
    }
  }
  if (_valuesNeeded.empty()) out += "\n" + newPrefix + "     <none>";

  // Recursively print the children nodes.
  for (std::vector<VRDisplayNode*>::const_iterator it = _children.begin();
       it != _children.end(); it++) {
    out += "\n" + (*it)->printNode(valuesSet, newPrefix);
  }

  return out;
}